

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-ft-math.c
# Opt level: O2

PVG_FT_Int ft_trig_prenorm(PVG_FT_Vector *vec)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  byte bVar4;
  uint uVar5;
  long lVar7;
  long lVar8;
  long lVar6;
  
  lVar7 = vec->x;
  lVar8 = vec->y;
  lVar3 = -lVar7;
  if (0 < lVar7) {
    lVar3 = lVar7;
  }
  lVar6 = -lVar8;
  if (0 < lVar8) {
    lVar6 = lVar8;
  }
  uVar5 = (uint)lVar6 | (uint)lVar3;
  uVar1 = 0x1f;
  if (uVar5 != 0) {
    for (; uVar5 >> uVar1 == 0; uVar1 = uVar1 - 1) {
    }
  }
  if (uVar1 < 0x1e) {
    iVar2 = 0x1d - uVar1;
    lVar7 = lVar7 << ((byte)iVar2 & 0x3f);
    lVar8 = lVar8 << ((byte)iVar2 & 0x3f);
  }
  else {
    iVar2 = (uVar1 ^ 0x1f) - 2;
    bVar4 = 2 - (char)(uVar1 ^ 0x1f);
    lVar7 = lVar7 >> (bVar4 & 0x3f);
    lVar8 = lVar8 >> (bVar4 & 0x3f);
  }
  vec->x = lVar7;
  vec->y = lVar8;
  return iVar2;
}

Assistant:

static PVG_FT_Int ft_trig_prenorm(PVG_FT_Vector* vec)
{
    PVG_FT_Pos x, y;
    PVG_FT_Int shift;

    x = vec->x;
    y = vec->y;

    shift = PVG_FT_MSB(PVG_FT_ABS(x) | PVG_FT_ABS(y));

    if (shift <= PVG_FT_TRIG_SAFE_MSB) {
        shift = PVG_FT_TRIG_SAFE_MSB - shift;
        vec->x = (PVG_FT_Pos)((PVG_FT_ULong)x << shift);
        vec->y = (PVG_FT_Pos)((PVG_FT_ULong)y << shift);
    } else {
        shift -= PVG_FT_TRIG_SAFE_MSB;
        vec->x = x >> shift;
        vec->y = y >> shift;
        shift = -shift;
    }

    return shift;
}